

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

Io_BlifObj_t ** Io_BlifHashLookup(Io_BlifMan_t *p,char *pName)

{
  uint uVar1;
  int iVar2;
  Io_BlifObj_t **local_28;
  Io_BlifObj_t **ppEntry;
  char *pName_local;
  Io_BlifMan_t *p_local;
  
  local_28 = p->pTable;
  uVar1 = Io_BlifHashString(pName,p->nTableSize);
  local_28 = local_28 + uVar1;
  while ((*local_28 != (Io_BlifObj_t *)0x0 && (iVar2 = strcmp((*local_28)->pName,pName), iVar2 != 0)
         )) {
    local_28 = &(*local_28)->pNext;
  }
  return local_28;
}

Assistant:

static Io_BlifObj_t ** Io_BlifHashLookup( Io_BlifMan_t * p, char * pName )
{
    Io_BlifObj_t ** ppEntry;
    for ( ppEntry = p->pTable + Io_BlifHashString(pName, p->nTableSize); *ppEntry; ppEntry = &(*ppEntry)->pNext )
        if ( !strcmp((*ppEntry)->pName, pName) )
            return ppEntry;
    return ppEntry;
}